

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_test.cpp
# Opt level: O0

void __thiscall license::test::MyGlobalFixture::setup(MyGlobalFixture *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  log_level lVar3;
  lazy_ostream *plVar4;
  string *__rhs;
  path local_200;
  path local_1e0;
  path local_1c0;
  path local_1a0;
  path local_180;
  path local_160;
  undefined1 local_140 [8];
  path pkf;
  allocator local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c8;
  assertion_result local_a8;
  basic_cstring<const_char> local_90;
  basic_cstring<const_char> local_80;
  byte local_6d;
  bool ok;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[20],_const_char_(&)[20]> local_60;
  basic_cstring<const_char> local_40;
  begin local_30;
  unit_test_log_t local_11;
  MyGlobalFixture *local_10;
  MyGlobalFixture *this_local;
  
  puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_10 = this;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/license_test.cpp"
             ,0x74);
  boost::unit_test::log::begin::begin(&local_30,&local_40,0x1d);
  lVar3 = boost::unit_test::unit_test_log_t::operator<<(puVar1,&local_30);
  boost::unit_test::unit_test_log_t::operator()(&local_11,lVar3);
  plVar4 = boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<(&local_60,plVar4,(char (*) [20])"setup temp project ");
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_11,&local_60.super_lazy_ostream);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[20],_const_char_(&)[20]>
  ::~lazy_ostream_impl(&local_60);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_11);
  bVar2 = boost::filesystem::exists((path *)project_path);
  if (bVar2) {
    boost::filesystem::remove_all((path *)project_path);
  }
  local_6d = boost::filesystem::create_directories((path *)licenses_path);
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/license_test.cpp"
               ,0x74);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_90);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_80,0x22,&local_90);
    boost::test_tools::assertion_result::assertion_result(&local_a8,(bool)(local_6d & 1));
    plVar4 = boost::unit_test::lazy_ostream::instance();
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_108,"Error creating ",&local_109);
    __rhs = boost::filesystem::path::string_abi_cxx11_((path *)licenses_path);
    std::operator+(&local_e8,&local_108,__rhs);
    boost::unit_test::operator<<(&local_c8,plVar4,&local_e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)((long)&pkf.m_pathname.field_2 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test/license_test.cpp"
               ,0x74);
    boost::test_tools::tt_detail::report_assertion
              (&local_a8,&local_c8,(undefined1 *)((long)&pkf.m_pathname.field_2 + 8),0x22,2,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    boost::test_tools::assertion_result::~assertion_result(&local_a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::filesystem::path::path
            (&local_180,
             "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]lcc-license-generator/test"
            );
  boost::filesystem::path::path(&local_1a0,"data");
  boost::filesystem::operator/(&local_160,&local_180,&local_1a0);
  boost::filesystem::path::path(&local_1c0,"private_key.rsa");
  boost::filesystem::operator/((path *)local_140,&local_160,&local_1c0);
  boost::filesystem::path::~path(&local_1c0);
  boost::filesystem::path::~path(&local_160);
  boost::filesystem::path::~path(&local_1a0);
  boost::filesystem::path::~path(&local_180);
  boost::filesystem::path::path(&local_200,"private_key.rsa");
  boost::filesystem::operator/(&local_1e0,(path *)project_path,&local_200);
  boost::filesystem::copy_file((path *)local_140,&local_1e0);
  boost::filesystem::path::~path(&local_1e0);
  boost::filesystem::path::~path(&local_200);
  boost::filesystem::path::~path((path *)local_140);
  return;
}

Assistant:

void setup() {
		BOOST_TEST_MESSAGE("setup temp project ");
		if (fs::exists(project_path)) {
			fs::remove_all(project_path);
		}
		bool ok = fs::create_directories(licenses_path);
		BOOST_REQUIRE_MESSAGE(ok, string("Error creating ") + licenses_path.string());
		fs::path pkf = fs::path(PROJECT_TEST_SRC_DIR) / "data" / PRIVATE_KEY_FNAME;
		fs::copy_file(pkf, project_path / PRIVATE_KEY_FNAME);
	}